

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O0

void __thiscall jbcoin::RPC::ErrorInfo::~ErrorInfo(ErrorInfo *this)

{
  ErrorInfo *this_local;
  
  std::__cxx11::string::~string((string *)&this->message);
  std::__cxx11::string::~string((string *)&this->token);
  return;
}

Assistant:

ErrorInfo (error_code_i code_, std::string const& token_,
        std::string const& message_)
        : code (code_)
        , token (token_)
        , message (message_)
    { }